

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

mat33 * nifti_mat33_inverse(mat33 R)

{
  double dVar1;
  mat33 *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  uint uVar9;
  uint uVar10;
  double dVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  dVar2 = (double)R.m[0][0];
  dVar1 = (double)R.m[0][2];
  dVar13 = (double)R.m[2][0];
  dVar5 = (double)R.m[2][2];
  dVar6 = (double)R.m[1][2];
  dVar3 = (double)R.m[1][0];
  dVar4 = (double)R.m[2][1];
  uVar12 = (ulong)DAT_00125140;
  uVar9 = SUB84(dVar13,0) ^ (uint)DAT_00125140;
  uVar10 = (uint)((ulong)dVar13 >> 0x20) ^ DAT_00125140._4_4_;
  dVar7 = (double)R.m[1][1];
  dVar8 = (double)R.m[0][1];
  dVar11 = dVar8 * (double)((ulong)dVar3 ^ uVar12);
  dVar15 = (double)CONCAT44(uVar10,uVar9) * dVar7;
  dVar14 = dVar15 * dVar1 +
           dVar13 * dVar8 * dVar6 +
           dVar3 * dVar4 * dVar1 + dVar11 * dVar5 + (dVar7 * dVar2 * dVar5 - dVar4 * dVar2 * dVar6);
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    dVar14 = 1.0 / dVar14;
  }
  in_RDI->m[0][0] = (float)((dVar7 * dVar5 + (double)((ulong)dVar4 ^ uVar12) * dVar6) * dVar14);
  in_RDI->m[0][1] = (float)((dVar5 * (double)((ulong)dVar8 ^ uVar12) + dVar1 * dVar4) * dVar14);
  in_RDI->m[0][2] = (float)((dVar6 * dVar8 + (double)(uVar12 ^ (ulong)dVar7) * dVar1) * dVar14);
  in_RDI->m[1][0] = (float)((dVar5 * (double)((ulong)dVar3 ^ uVar12) + dVar13 * dVar6) * dVar14);
  in_RDI->m[1][1] = (float)((dVar2 * dVar5 + (double)CONCAT44(uVar10,uVar9) * dVar1) * dVar14);
  in_RDI->m[1][2] = (float)(((double)((ulong)dVar2 ^ uVar12) * dVar6 + dVar3 * dVar1) * dVar14);
  in_RDI->m[2][0] = (float)((dVar4 * dVar3 + dVar15) * dVar14);
  in_RDI->m[2][1] = (float)(((double)((ulong)dVar2 ^ uVar12) * dVar4 + dVar13 * dVar8) * dVar14);
  in_RDI->m[2][2] = (float)((dVar7 * dVar2 + dVar11) * dVar14);
  return in_RDI;
}

Assistant:

mat33 nifti_mat33_inverse( mat33 R )   /* inverse of 3x3 matrix */
{
   double r11,r12,r13,r21,r22,r23,r31,r32,r33 , deti ;
   mat33 Q ;
                                                       /*  INPUT MATRIX:  */
   r11 = R.m[0][0]; r12 = R.m[0][1]; r13 = R.m[0][2];  /* [ r11 r12 r13 ] */
   r21 = R.m[1][0]; r22 = R.m[1][1]; r23 = R.m[1][2];  /* [ r21 r22 r23 ] */
   r31 = R.m[2][0]; r32 = R.m[2][1]; r33 = R.m[2][2];  /* [ r31 r32 r33 ] */

   deti = r11*r22*r33-r11*r32*r23-r21*r12*r33
         +r21*r32*r13+r31*r12*r23-r31*r22*r13 ;

   if( deti != 0.0l ) deti = 1.0l / deti ;

   Q.m[0][0] = (float)( deti*( r22*r33-r32*r23) ) ;
   Q.m[0][1] = (float)( deti*(-r12*r33+r32*r13) ) ;
   Q.m[0][2] = (float)( deti*( r12*r23-r22*r13) ) ;

   Q.m[1][0] = (float)( deti*(-r21*r33+r31*r23) ) ;
   Q.m[1][1] = (float)( deti*( r11*r33-r31*r13) ) ;
   Q.m[1][2] = (float)( deti*(-r11*r23+r21*r13) ) ;

   Q.m[2][0] = (float)( deti*( r21*r32-r31*r22) ) ;
   Q.m[2][1] = (float)( deti*(-r11*r32+r31*r12) ) ;
   Q.m[2][2] = (float)( deti*( r11*r22-r21*r12) ) ;

   return Q ;
}